

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

ostream * operator<<(ostream *s,Function *f)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ostream *poVar4;
  uint i;
  uint i_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Matrix m;
  Matrix local_230;
  Matrix local_130;
  
  dVar1 = f->dXMin;
  dVar2 = f->dXStep;
  dVar3 = floor((f->dXMax - dVar1) / dVar2 + 0.5);
  i = (uint)dVar3;
  Matrix::Matrix(&m,i,2);
  Function::unvalidate(f);
  dVar1 = floor(dVar1 / dVar2 + 0.5);
  i_00 = 0;
  if ((int)i < 1) {
    i = 0;
  }
  for (; i != i_00; i_00 = i_00 + 1) {
    dVar2 = (double)(int)((int)dVar1 + i_00) * f->dXStep;
    Function::setXInput(f,dVar2);
    Matrix::operator[](&local_230,&m,i_00);
    Matrix::operator[](&local_130,&local_230,0);
    Matrix::operator=(&local_130,dVar2);
    Matrix::~Matrix(&local_130);
    Matrix::~Matrix(&local_230);
    (*(f->super_Physical)._vptr_Physical[0xc])(f);
    Matrix::operator[](&local_230,&m,i_00);
    Matrix::operator[](&local_130,&local_230,1);
    Matrix::operator=(&local_130,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Matrix::~Matrix(&local_130);
    Matrix::~Matrix(&local_230);
    if ((i_00 & 7) == 0) {
      std::operator<<((ostream *)&std::cout,"\rdisplaying function: ");
      poVar4 = std::ostream::_M_insert<double>(((double)(int)i_00 / (double)(int)dVar3) * 100.0);
      std::operator<<(poVar4,"%         \t");
      std::ostream::flush();
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"\rdisplaying function: done.         \t");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = operator<<(s,&m);
  Matrix::~Matrix(&m);
  return poVar4;
}

Assistant:

ostream& operator<<(ostream& s, Function& f)
{
	// only x input
	int n = int(floor((f.dXMax - f.dXMin)/f.dXStep + 0.5));
	int c = int(floor(f.dXMin/f.dXStep + 0.5));
	Matrix m( n, 2 );
	double d = f.dXMin;
        f.unvalidate();
 	for (int i=0; i<n; ++i, ++c) {
		d = c * f.dXStep;
		f.setXInput(d);
		m[i][0] = d;
		m[i][1] = f.getValue();
		if (!(i&0x7)) cout << "\rdisplaying function: " << double(i) / double(n) * 100.0 << "%         \t" << flush;
	}
	cout << "\rdisplaying function: done.         \t" << endl;
	
	// x and y input
	
	return s << m;
}